

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O0

void __thiscall
ScriptMemoryDumper::DumpHeapBucket<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  TBlockAllocatorType *pTVar1;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *local_28;
  SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
  *currentAllocator;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket_local;
  uint index_local;
  ScriptMemoryDumper *this_local;
  
  local_28 = Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
             GetAllocator(heapBucket);
  do {
    heapBlock = &Memory::
                 SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
                 ::GetHeapBlock(local_28)->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
    DumpSmallHeapBlock<MediumAllocationBlockAttributes>(this,heapBlock);
    local_28 = Memory::
               SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
               ::GetNext(local_28);
    pTVar1 = Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
             GetAllocator(heapBucket);
  } while (local_28 != pTVar1);
  DumpSmallHeapBlockList<MediumAllocationBlockAttributes>
            (this,&heapBucket->fullBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>
            );
  DumpSmallHeapBlockList<MediumAllocationBlockAttributes>
            (this,&heapBucket->heapBlockList->super_SmallHeapBlockT<MediumAllocationBlockAttributes>
            );
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}